

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O0

string * __thiscall
soul::HTMLGenerator::run_abi_cxx11_
          (string *__return_storage_ptr__,HTMLGenerator *this,CompileMessageList *errors,
          HTMLGenerationOptions *options)

{
  bool bVar1;
  ulong uVar2;
  HTMLElement *pHVar3;
  vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_> *pvVar4;
  reference this_00;
  string_view value;
  bool local_7e2;
  string local_718;
  byte local_6f3;
  byte local_6f2;
  allocator<char> local_6f1;
  string local_6f0;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  undefined1 local_688 [8];
  string doc;
  HTMLElement *c_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_> *__range2_2;
  HTMLElement *c;
  iterator __end2_1;
  iterator __begin2_1;
  vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_> *__range2_1;
  ostringstream contentText;
  ostringstream local_4b0 [8];
  ostringstream navText;
  allocator<char> local_331;
  string local_330;
  HTMLElement *local_310;
  HTMLElement *body;
  char *local_300;
  allocator<char> local_2f1;
  string local_2f0;
  string_view local_2d0;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  string_view local_270;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  HTMLElement *local_210;
  HTMLElement *head;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  undefined1 local_1a8 [8];
  HTMLElement root;
  File *f;
  iterator __end2;
  iterator __begin2;
  vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_> *__range2;
  allocator<char> local_109;
  string local_108;
  undefined1 local_e8 [8];
  HTMLElement content;
  HTMLElement nav;
  HTMLGenerationOptions *options_local;
  CompileMessageList *errors_local;
  HTMLGenerator *this_local;
  
  ArrayView<soul::RefCountedPtr<soul::SourceCodeText>>::
  ArrayView<std::vector<soul::RefCountedPtr<soul::SourceCodeText>,std::allocator<soul::RefCountedPtr<soul::SourceCodeText>>>>
            ((ArrayView<soul::RefCountedPtr<soul::SourceCodeText>> *)
             &nav.children.
              super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&options->sourceFiles);
  bVar1 = SourceCodeModel::rebuild(&this->model,errors,stack0xffffffffffffffc8);
  if (bVar1) {
    createNav((HTMLElement *)
              &content.children.
               super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"section",&local_109);
    choc::html::HTMLElement::HTMLElement((HTMLElement *)local_e8,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range2,"content");
    choc::html::HTMLElement::setID((HTMLElement *)local_e8,___range2);
    __end2 = std::vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>
             ::begin((vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>
                      *)this);
    f = (File *)std::
                vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>::
                end((vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>
                     *)this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<soul::SourceCodeModel::File_*,_std::vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>_>
                                       *)&f), bVar1) {
      root.children.
      super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<soul::SourceCodeModel::File_*,_std::vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>_>
                    ::operator*(&__end2);
      printLibrary(this,(HTMLElement *)local_e8,
                   (File *)root.children.
                           super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<soul::SourceCodeModel::File_*,_std::vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>_>
      ::operator++(&__end2);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_4b0);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range2_1);
      pvVar4 = choc::html::HTMLElement::getChildren
                         ((HTMLElement *)
                          &content.children.
                           super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __end2_1 = std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>::
                 begin(pvVar4);
      c = (HTMLElement *)
          std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>::end
                    (pvVar4);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<choc::html::HTMLElement_*,_std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>_>
                                 *)&c), bVar1) {
        this_00 = __gnu_cxx::
                  __normal_iterator<choc::html::HTMLElement_*,_std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>_>
                  ::operator*(&__end2_1);
        choc::html::HTMLElement::writeToStream<std::__cxx11::ostringstream>
                  (this_00,(basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                            *)local_4b0,false);
        __gnu_cxx::
        __normal_iterator<choc::html::HTMLElement_*,_std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>_>
        ::operator++(&__end2_1);
      }
      pvVar4 = choc::html::HTMLElement::getChildren((HTMLElement *)local_e8);
      __end2_2 = std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>::
                 begin(pvVar4);
      c_1 = (HTMLElement *)
            std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>::end
                      (pvVar4);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_2,
                                (__normal_iterator<choc::html::HTMLElement_*,_std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>_>
                                 *)&c_1), bVar1) {
        doc.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<choc::html::HTMLElement_*,_std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>_>
             ::operator*(&__end2_2);
        choc::html::HTMLElement::writeToStream<std::__cxx11::ostringstream>
                  ((HTMLElement *)doc.field_2._8_8_,
                   (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &__range2_1,false);
        __gnu_cxx::
        __normal_iterator<choc::html::HTMLElement_*,_std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>_>
        ::operator++(&__end2_2);
      }
      std::__cxx11::string::string((string *)local_688,(string *)&options->templateContent);
      std::allocator<char>::allocator();
      local_6f2 = 0;
      local_6f3 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6a8,"$NAVIGATION",&local_6a9);
      std::__cxx11::ostringstream::str();
      bVar1 = replaceTemplatePlaceholder(this,errors,(string *)local_688,&local_6a8,&local_6d0);
      local_7e2 = false;
      if (bVar1) {
        std::allocator<char>::allocator();
        local_6f2 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6f0,"$CONTENT",&local_6f1);
        local_6f3 = 1;
        std::__cxx11::ostringstream::str();
        local_7e2 = replaceTemplatePlaceholder
                              (this,errors,(string *)local_688,&local_6f0,&local_718);
        std::__cxx11::string::~string((string *)&local_718);
      }
      if ((local_6f3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_6f0);
      }
      if ((local_6f2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_6f1);
      }
      std::__cxx11::string::~string((string *)&local_6d0);
      std::__cxx11::string::~string((string *)&local_6a8);
      std::allocator<char>::~allocator(&local_6a9);
      if (local_7e2 == false) {
        std::__cxx11::string::string((string *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_688);
      }
      std::__cxx11::string::~string((string *)local_688);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range2_1);
      std::__cxx11::ostringstream::~ostringstream(local_4b0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"html",&local_1c9);
      choc::html::HTMLElement::HTMLElement((HTMLElement *)local_1a8,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator(&local_1c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"lang",&local_1f1);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&head,"en-US");
      choc::html::HTMLElement::setProperty((HTMLElement *)local_1a8,&local_1f0,_head);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator(&local_1f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"head",&local_231);
      pHVar3 = choc::html::HTMLElement::addChild((HTMLElement *)local_1a8,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator(&local_231);
      local_210 = pHVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"title",&local_259);
      pHVar3 = choc::html::HTMLElement::addChild(pHVar3,&local_258);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_270,"SOUL Documentation");
      choc::html::HTMLElement::addContent(pHVar3,local_270);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator(&local_259);
      pHVar3 = local_210;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"link",&local_291);
      pHVar3 = choc::html::HTMLElement::addChild(pHVar3,&local_290);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"rel",&local_2b9);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_2d0,"stylesheet");
      pHVar3 = choc::html::HTMLElement::setProperty(pHVar3,&local_2b8,local_2d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"href",&local_2f1);
      value = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&options->cssFilename);
      local_300 = value._M_str;
      body = (HTMLElement *)value._M_len;
      choc::html::HTMLElement::setProperty(pHVar3,&local_2f0,value);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::allocator<char>::~allocator(&local_2f1);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::allocator<char>::~allocator(&local_2b9);
      std::__cxx11::string::~string((string *)&local_290);
      std::allocator<char>::~allocator(&local_291);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"body",&local_331);
      pHVar3 = choc::html::HTMLElement::addChild((HTMLElement *)local_1a8,&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      std::allocator<char>::~allocator(&local_331);
      local_310 = pHVar3;
      choc::html::HTMLElement::addChild
                (pHVar3,(HTMLElement *)
                        &content.children.
                         super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      choc::html::HTMLElement::addChild(local_310,(HTMLElement *)local_e8);
      choc::html::HTMLElement::toDocument_abi_cxx11_
                (__return_storage_ptr__,(HTMLElement *)local_1a8,true);
      choc::html::HTMLElement::~HTMLElement((HTMLElement *)local_1a8);
    }
    choc::html::HTMLElement::~HTMLElement((HTMLElement *)local_e8);
    choc::html::HTMLElement::~HTMLElement
              ((HTMLElement *)
               &content.children.
                super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string run (soul::CompileMessageList& errors,
                     const HTMLGenerationOptions& options)
    {
        if (! model.rebuild (errors, options.sourceFiles))
            return {};

        auto nav = createNav();

        choc::html::HTMLElement content ("section");
        content.setID ("content");

        for (auto& f : model.files)
            printLibrary (content, f);

        if (options.templateContent.empty())
        {
            choc::html::HTMLElement root ("html");
            root.setProperty ("lang", "en-US");

            auto& head = root.addChild ("head");
            head.addChild ("title").addContent ("SOUL Documentation");
            head.addChild ("link").setProperty ("rel", "stylesheet")
                                  .setProperty ("href", options.cssFilename);

            auto& body = root.addChild ("body");
            body.addChild (std::move (nav));
            body.addChild (std::move (content));
            return root.toDocument (true);
        }

        std::ostringstream navText, contentText;

        for (auto& c : nav.getChildren())
            c.writeToStream (navText, false);

        for (auto& c : content.getChildren())
            c.writeToStream (contentText, false);

        auto doc = options.templateContent;

        if (replaceTemplatePlaceholder (errors, doc, "$NAVIGATION", navText.str())
             && replaceTemplatePlaceholder (errors, doc, "$CONTENT", contentText.str()))
        {
            return doc;
        }

        return {};
    }